

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

bool ON_TransformPointGrid
               (int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
               int point_stride1,double *point,ON_Xform *xform)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = 0;
  if (point_count0 < 1) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      bVar1 = ON_TransformPointList(dim,is_rat,point_count1,point_stride1,point,xform);
      bVar2 = (bool)((iVar3 == 0 | bVar2) & bVar1);
      iVar3 = iVar3 + 1;
      point = point + point_stride0;
    } while (point_count0 != iVar3);
  }
  return bVar2;
}

Assistant:

bool 
ON_TransformPointGrid(
                  int dim, bool is_rat, 
                  int point_count0, int point_count1,
                  int point_stride0, int point_stride1,
                  double* point,
                  const ON_Xform& xform
                  )
{
  bool rc = false;
  int i;
  double* pt = point;
  for ( i = 0; i < point_count0; i++ ) {
    if ( !ON_TransformPointList( dim, is_rat, point_count1, point_stride1, pt, xform ) ) {
      rc = false;
    }
    else if ( !i ) {
      rc = true;
    }
    pt += point_stride0;
  }
  return rc;
}